

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O2

void __thiscall
bloaty::RangeSink::AddVMRange
          (RangeSink *this,char *analyzer,uint64_t vmaddr,uint64_t vmsize,string *name)

{
  pointer ppVar1;
  bool verbose;
  bool bVar2;
  char *pcVar3;
  pointer ppVar4;
  string_view name_00;
  string_view format;
  Arg *a2;
  string label;
  Arg local_e0;
  string local_b0;
  Arg local_90;
  Arg local_60;
  
  verbose = IsVerboseForVMRange(this,vmaddr,vmsize);
  if (verbose) {
    pcVar3 = GetDataSourceLabel(this->data_source_);
    printf("[%s, %s] AddVMRange(%.*s, %lx, %lx)\n",pcVar3,analyzer,
           (ulong)(uint)name->_M_string_length,(name->_M_dataplus)._M_p,vmaddr,vmsize);
  }
  if (this->translator_ != (DualMap *)0x0) {
    ppVar1 = (this->outputs_).
             super__Vector_base<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (ppVar4 = (this->outputs_).
                  super__Vector_base<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppVar4 != ppVar1; ppVar4 = ppVar4 + 1)
    {
      name_00._M_str = (name->_M_dataplus)._M_p;
      name_00._M_len = name->_M_string_length;
      NameMunger::Munge_abi_cxx11_(&label,ppVar4->second,name_00);
      a2 = (Arg *)&ppVar4->first->file_map;
      bVar2 = RangeMap::AddRangeWithTranslation
                        (&ppVar4->first->vm_map,vmaddr,vmsize,&label,&this->translator_->vm_map,
                         verbose,(RangeMap *)a2);
      if (!bVar2 && 0 < verbose_level) {
        absl::substitute_internal::Arg::Arg(&local_90,vmaddr);
        absl::substitute_internal::Arg::Arg(&local_60,vmsize);
        local_e0.piece_._M_str = (name->_M_dataplus)._M_p;
        local_e0.piece_._M_len = name->_M_string_length;
        format._M_str = (char *)&local_90;
        format._M_len = (size_t)"VM range ($0, $1) for label $2 extends beyond base map";
        absl::Substitute_abi_cxx11_(&local_b0,(absl *)0x36,format,&local_60,&local_e0,a2);
        printf("WARNING: %s\n",local_b0._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&local_b0);
      }
      std::__cxx11::string::~string((string *)&label);
    }
    return;
  }
  __assert_fail("translator_",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/bloaty.cc",
                0x50a,
                "void bloaty::RangeSink::AddVMRange(const char *, uint64_t, uint64_t, const std::string &)"
               );
}

Assistant:

void RangeSink::AddVMRange(const char* analyzer, uint64_t vmaddr,
                           uint64_t vmsize, const std::string& name) {
  bool verbose = IsVerboseForVMRange(vmaddr, vmsize);
  if (verbose) {
    printf("[%s, %s] AddVMRange(%.*s, %" PRIx64 ", %" PRIx64 ")\n",
           GetDataSourceLabel(data_source_), analyzer, (int)name.size(),
           name.data(), vmaddr, vmsize);
  }
  assert(translator_);
  for (auto& pair : outputs_) {
    const std::string label = pair.second->Munge(name);
    bool ok = pair.first->vm_map.AddRangeWithTranslation(
        vmaddr, vmsize, label, translator_->vm_map, verbose,
        &pair.first->file_map);
    if (!ok) {
      WARN("VM range ($0, $1) for label $2 extends beyond base map", vmaddr,
           vmsize, name);
    }
  }
}